

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::OFFImporter::CanRead(OFFImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  long lVar2;
  char *local_68;
  char *tokens [1];
  undefined1 local_50 [8];
  string extension;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  OFFImporter *this_local;
  
  extension.field_2._M_local_buf[0xf] = checkSig;
  BaseImporter::GetExtension((string *)local_50,pFile);
  bVar1 = std::operator==((string *)local_50,"off");
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    lVar2 = std::__cxx11::string::length();
    if ((lVar2 == 0) || ((extension.field_2._M_local_buf[0xf] & 1U) != 0)) {
      if (pIOHandler == (IOSystem *)0x0) {
        this_local._7_1_ = true;
      }
      else {
        local_68 = "off";
        this_local._7_1_ =
             BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_68,1,3,false,false);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  tokens[0]._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool OFFImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string extension = GetExtension(pFile);

    if (extension == "off")
        return true;
    else if (!extension.length() || checkSig)
    {
        if (!pIOHandler)return true;
        const char* tokens[] = {"off"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,3);
    }
    return false;
}